

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::PalSkyCommand::PalSkyCommand
          (PalSkyCommand *this,uint32_t solid_top,uint32_t solid_bottom)

{
  int local_1c;
  int col;
  uint32_t solid_bottom_local;
  uint32_t solid_top_local;
  PalSkyCommand *this_local;
  
  DrawerCommand::DrawerCommand(&this->super_DrawerCommand);
  (this->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)&PTR__PalSkyCommand_009eab80;
  *(uint32_t *)&(this->super_DrawerCommand).field_0xc = solid_top;
  this->solid_bottom = solid_bottom;
  this->_dest = drawerargs::dc_dest;
  this->_count = drawerargs::dc_count;
  this->_pitch = drawerargs::dc_pitch;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    this->_source[local_1c] = *(uint8_t **)(drawerargs::dc_wall_source + (long)local_1c * 8);
    this->_source2[local_1c] = *(uint8_t **)(drawerargs::dc_wall_source2 + (long)local_1c * 8);
    this->_sourceheight[local_1c] = (&drawerargs::dc_wall_sourceheight)[local_1c];
    this->_iscale[local_1c] = *(uint32_t *)(drawerargs::dc_wall_iscale + (long)local_1c * 4);
    this->_texturefrac[local_1c] =
         *(uint32_t *)(drawerargs::dc_wall_texturefrac + (long)local_1c * 4);
  }
  return;
}

Assistant:

PalSkyCommand::PalSkyCommand(uint32_t solid_top, uint32_t solid_bottom) : solid_top(solid_top), solid_bottom(solid_bottom)
	{
		using namespace drawerargs;

		_dest = dc_dest;
		_count = dc_count;
		_pitch = dc_pitch;
		for (int col = 0; col < 4; col++)
		{
			_source[col] = dc_wall_source[col];
			_source2[col] = dc_wall_source2[col];
			_sourceheight[col] = dc_wall_sourceheight[col];
			_iscale[col] = dc_wall_iscale[col];
			_texturefrac[col] = dc_wall_texturefrac[col];
		}
	}